

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTransaction::CheckTxOutIndex
          (ConfidentialTransaction *this,uint32_t index,int line,char *caller)

{
  CfdException *this_00;
  allocator local_55;
  uint32_t index_local;
  string local_50;
  CfdSourceLocation location;
  
  if ((ulong)index <
      (ulong)(((long)(this->vout_).
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->vout_).
                    super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xf8)) {
    return;
  }
  location.filename = "cfdcore_elements_transaction.cpp";
  index_local = index;
  location.line = line;
  location.funcname = caller;
  logger::warn<unsigned_int&>(&location,"vout[{}] out_of_range.",&index_local);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_50,"vout out_of_range error.",&local_55);
  CfdException::CfdException(this_00,kCfdOutOfRangeError,&local_50);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::CheckTxOutIndex(
    uint32_t index, int line, const char *caller) const {
  if (vout_.size() <= index) {
    cfd::core::logger::CfdSourceLocation location = {
        CFD_LOG_FILE, line, caller};
    warn(location, "vout[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "vout out_of_range error.");
  }
}